

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

AssertionResult __thiscall
testing::internal::CmpHelperEQ
          (internal *this,char *lhs_expression,char *rhs_expression,BiggestInt lhs,BiggestInt rhs)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX;
  AssertionResult AVar2;
  string local_70;
  string local_50;
  BiggestInt local_30;
  BiggestInt rhs_local;
  BiggestInt lhs_local;
  char *rhs_expression_local;
  char *lhs_expression_local;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> sVar1
  ;
  
  local_30 = rhs;
  rhs_local = lhs;
  lhs_local = (BiggestInt)rhs_expression;
  rhs_expression_local = lhs_expression;
  lhs_expression_local = (char *)this;
  if (lhs == rhs) {
    AVar2 = AssertionSuccess();
    sVar1 = AVar2.message_.ptr_;
  }
  else {
    FormatForComparisonFailureMessage<long_long,long_long>
              (&local_50,(internal *)&rhs_local,&local_30,(longlong *)lhs);
    FormatForComparisonFailureMessage<long_long,long_long>
              (&local_70,(internal *)&local_30,&rhs_local,(longlong *)lhs);
    EqFailure(this,lhs_expression,rhs_expression,&local_50,&local_70,false);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
    sVar1.ptr_ = extraout_RDX;
  }
  AVar2.message_.ptr_ = sVar1.ptr_;
  AVar2._0_8_ = this;
  return AVar2;
}

Assistant:

AssertionResult CmpHelperEQ(const char* lhs_expression,
                            const char* rhs_expression,
                            BiggestInt lhs,
                            BiggestInt rhs) {
  if (lhs == rhs) {
    return AssertionSuccess();
  }

  return EqFailure(lhs_expression,
                   rhs_expression,
                   FormatForComparisonFailureMessage(lhs, rhs),
                   FormatForComparisonFailureMessage(rhs, lhs),
                   false);
}